

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

vector<duckdb::PrimitiveType<long>,_true> *
duckdb::EquiWidthBinsInteger::Operation
          (vector<duckdb::PrimitiveType<long>,_true> *__return_storage_ptr__,Expression *expr,
          int64_t input_min,int64_t input_max,idx_t bin_count,bool nice_rounding)

{
  pointer pPVar1;
  pointer pPVar2;
  char cVar3;
  uint64_t uVar4;
  reference pvVar5;
  hugeint_t hVar6;
  undefined1 auVar7 [16];
  ulong local_c0;
  hugeint_t max;
  hugeint_t new_step;
  hugeint_t span;
  hugeint_t min;
  hugeint_t step;
  hugeint_t new_max;
  hugeint_t FACTOR;
  hugeint_t local_40;
  
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::hugeint_t::hugeint_t(&FACTOR,1000);
  duckdb::hugeint_t::hugeint_t(&max,input_min);
  min = (hugeint_t)duckdb::hugeint_t::operator*(&max,&FACTOR);
  duckdb::hugeint_t::hugeint_t(&span,input_max);
  max = (hugeint_t)duckdb::hugeint_t::operator*(&span,&FACTOR);
  span = (hugeint_t)duckdb::hugeint_t::operator-(&max,&min);
  new_step = Hugeint::Convert<unsigned_long>(bin_count);
  step = (hugeint_t)duckdb::hugeint_t::operator/(&span,&new_step);
  local_c0 = bin_count;
  hVar6 = max;
  if (nice_rounding) {
    new_step = MakeNumberNice(step,step,ROUND);
    new_max = RoundToNumber(max,new_step,CEILING);
    cVar3 = duckdb::hugeint_t::operator!=(&new_max,&min);
    if (cVar3 != '\0') {
      duckdb::hugeint_t::hugeint_t(&local_40,0);
      cVar3 = duckdb::hugeint_t::operator!=(&new_step,&local_40);
      if (cVar3 != '\0') {
        max = new_max;
        step = new_step;
      }
    }
    local_c0 = bin_count * 2;
    hVar6 = max;
  }
  new_step = hVar6;
  max = new_step;
  do {
    cVar3 = duckdb::hugeint_t::operator>(&new_step,&min);
    if (cVar3 == '\0') {
      return __return_storage_ptr__;
    }
    auVar7 = duckdb::hugeint_t::operator/(&new_step,&FACTOR);
    hVar6.upper = auVar7._8_8_;
    hVar6.lower = hVar6.upper;
    uVar4 = Hugeint::Cast<long>(auVar7._0_8_,hVar6);
    pPVar1 = (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar1 == pPVar2) {
LAB_00712003:
      new_max.lower = uVar4;
      std::vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>::
      emplace_back<duckdb::PrimitiveType<long>>
                ((vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>> *)
                 __return_storage_ptr__,(PrimitiveType<long> *)&new_max);
    }
    else {
      if ((long)uVar4 < input_min) {
        return __return_storage_ptr__;
      }
      if (local_c0 <= (ulong)((long)pPVar2 - (long)pPVar1 >> 3)) {
        return __return_storage_ptr__;
      }
      pvVar5 = vector<duckdb::PrimitiveType<long>,_true>::back(__return_storage_ptr__);
      if (uVar4 != pvVar5->val) goto LAB_00712003;
    }
    duckdb::hugeint_t::operator-=(&new_step,&step);
  } while( true );
}

Assistant:

static vector<PrimitiveType<int64_t>> Operation(const Expression &expr, int64_t input_min, int64_t input_max,
	                                                idx_t bin_count, bool nice_rounding) {
		vector<PrimitiveType<int64_t>> result;
		// to prevent integer truncation from affecting the bin boundaries we calculate them with numbers multiplied by
		// 1000 we then divide to get the actual boundaries
		const auto FACTOR = hugeint_t(1000);
		auto min = hugeint_t(input_min) * FACTOR;
		auto max = hugeint_t(input_max) * FACTOR;

		const hugeint_t span = max - min;
		hugeint_t step = span / Hugeint::Convert(bin_count);
		if (nice_rounding) {
			// when doing nice rounding we try to make the max/step values nicer
			hugeint_t new_step = MakeNumberNice(step, step, NiceRounding::ROUND);
			hugeint_t new_max = RoundToNumber(max, new_step, NiceRounding::CEILING);
			if (new_max != min && new_step != 0) {
				max = new_max;
				step = new_step;
			}
			// we allow for more bins when doing nice rounding since the bin count is approximate
			bin_count *= 2;
		}
		for (hugeint_t bin_boundary = max; bin_boundary > min; bin_boundary -= step) {
			const hugeint_t target_boundary = bin_boundary / FACTOR;
			int64_t real_boundary = Hugeint::Cast<int64_t>(target_boundary);
			if (!result.empty()) {
				if (real_boundary < input_min || result.size() >= bin_count) {
					// we can never generate input_min
					break;
				}
				if (real_boundary == result.back().val) {
					// we cannot generate the same value multiple times in a row - skip this step
					continue;
				}
			}
			result.push_back(real_boundary);
		}
		return result;
	}